

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractorValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)609>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  LogMessage *other;
  undefined8 *puVar4;
  SupportVectorClassifier *pSVar5;
  _Alloc_hider _Var6;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  undefined1 local_80 [40];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_58;
  TypeCase local_3c [3];
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x261) {
    local_90 = (undefined1  [8])local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Model not an array feature extractor.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
    _Var6._M_p = (pointer)local_90;
    if (local_90 == (undefined1  [8])local_80) {
      return __return_storage_ptr__;
    }
    goto LAB_004d6300;
  }
  Result::Result((Result *)&local_b8);
  validateModelDescription((Result *)local_90,interface,format->specificationversion_);
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_88);
  pcVar2 = local_80 + 8;
  if (local_88._M_p != pcVar2) {
    operator_delete(local_88._M_p,local_80._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_b8);
  if (bVar3) {
    local_3c[0] = 5;
    __l._M_len = 1;
    __l._M_array = local_3c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_58,__l,&local_b9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_90,(CoreML *)&interface->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_58,
               in_R8);
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_90;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_88);
    if (local_88._M_p != pcVar2) {
      operator_delete(local_88._M_p,local_80._8_8_ + 1);
    }
    if (local_58.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = Result::good((Result *)&local_b8);
    if (!bVar3) goto LAB_004d629f;
    local_3c[0] = kDoubleType;
    local_3c[1] = kInt64Type;
    local_3c[2] = 5;
    __l_00._M_len = 3;
    __l_00._M_array = local_3c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_58,__l_00,&local_b9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_90,(CoreML *)&interface->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_58,
               in_R8);
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_90;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_88);
    if (local_88._M_p != pcVar2) {
      operator_delete(local_88._M_p,local_80._8_8_ + 1);
    }
    if (local_58.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = Result::good((Result *)&local_b8);
    if (!bVar3) goto LAB_004d629f;
    if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        other = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_90,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,other);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_90);
      }
      puVar4 = *(undefined8 **)
                ((long)((interface->output_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x20);
      if (puVar4 == (undefined8 *)0x0) {
        puVar4 = &Specification::_FeatureType_default_instance_;
      }
      if (*(int *)((long)puVar4 + 0x24) == 2) {
        if (format->_oneof_case_[0] == 0x261) {
          pSVar5 = (format->Type_).supportvectorclassifier_;
        }
        else {
          pSVar5 = (SupportVectorClassifier *)
                   Specification::ArrayFeatureExtractor::default_instance();
        }
        if (((RepeatedField<unsigned_long> *)&pSVar5->numberofsupportvectorsperclass_)->
            current_size_ != 1) {
          local_90 = (undefined1  [8])local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,
                     "If output type is Double in interface, exactly one extraction index must be specified."
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
          goto LAB_004d627b;
        }
      }
      goto LAB_004d629f;
    }
    local_90 = (undefined1  [8])local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Exactly one input array column must be specified.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
LAB_004d627b:
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
  }
  else {
LAB_004d629f:
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_b8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p == &local_a0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_a0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_b0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p == &local_a0) {
    return __return_storage_ptr__;
  }
  local_80._0_8_ = CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
  _Var6._M_p = local_b0._M_p;
LAB_004d6300:
  operator_delete(_Var6._M_p,local_80._0_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_arrayFeatureExtractor>(const Specification::Model& format) {
        const auto& interface = format.description();
        
            // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_arrayfeatureextractor()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an array feature extractor.");
        }
        

        Result result;
        
            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             1,
                                                             {Specification::FeatureType::kMultiArrayType
                                                             });
        if (!result.good()) {
            return result;
        }
        
            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kMultiArrayType});
        
        if (!result.good()) {
            return result;
        }
        
        if(interface.input().size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Exactly one input array column must be specified.");
        }
        
        if(interface.output(0).type().Type_case() == Specification::FeatureType::kDoubleType
           && format.arrayfeatureextractor().extractindex_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If output type is Double in interface, exactly one extraction index must be specified.");
        }
        
        
            // TODO: check that the index is valid given the length of the input array.
            // auto index = format.arrayfeatureextractor().inputindex();
        
        return result;
    }